

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O1

uint64_t helper_iwmmxt_sllw_aarch64(CPUARMState_conflict *env,uint64_t x,uint32_t n)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  bVar1 = (byte)n;
  uVar5 = x << (bVar1 & 0x3f);
  uVar3 = uVar5 & 0xffff;
  uVar2 = ((uint)x & 0xffff0000) << (bVar1 & 0x3f);
  uVar4 = (x & 0xffff00000000) << (bVar1 & 0x3f);
  uVar7 = uVar4 & 0xffff00000000;
  uVar6 = (x & 0xffff000000000000) << (bVar1 & 0x3f);
  (env->iwmmxt).cregs[3] =
       (uint)(uVar6 == 0) << 0x1e | (uint)(0x7fff000000000000 < uVar6) << 0x1f |
       (uint)(uVar3 == 0) << 6 | (uint)(uVar5 >> 8) & 0x80 | uVar2 >> 0x10 & 0x8000 |
       (uint)((ulong)uVar2 == 0) << 0xe | (uint)(uVar4 >> 0x18) & 0x800000 |
       (uint)(uVar7 == 0) << 0x16;
  return uVar7 + uVar6 | (ulong)uVar2 | uVar3;
}

Assistant:

uint64_t HELPER(iwmmxt_sllw)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = (((x & (0xffffll << 0)) << n) & (0xffffll << 0)) |
        (((x & (0xffffll << 16)) << n) & (0xffffll << 16)) |
        (((x & (0xffffll << 32)) << n) & (0xffffll << 32)) |
        (((x & (0xffffll << 48)) << n) & (0xffffll << 48));
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(x >> 0, 0) | NZBIT16(x >> 16, 1) |
        NZBIT16(x >> 32, 2) | NZBIT16(x >> 48, 3);
    return x;
}